

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_EulerAngles.cpp
# Opt level: O0

KBOOL __thiscall
KDIS::DATA_TYPE::LE_EulerAngles::operator==(LE_EulerAngles *this,LE_EulerAngles *Value)

{
  KBOOL KVar1;
  KFIXED<char,_(unsigned_char)__x03_> local_60;
  KFIXED<char,_(unsigned_char)__x03_> local_50 [2];
  KFIXED<char,_(unsigned_char)__x03_> local_30;
  LE_EulerAngles *local_20;
  LE_EulerAngles *Value_local;
  LE_EulerAngles *this_local;
  
  local_20 = Value;
  Value_local = this;
  KFIXED<char,_(unsigned_char)'\x03'>::KFIXED(&local_30,&Value->m_Psi);
  KVar1 = KFIXED<char,_(unsigned_char)'\x03'>::operator!=(&this->m_Psi,&local_30);
  KFIXED<char,_(unsigned_char)'\x03'>::~KFIXED(&local_30);
  if (KVar1) {
    this_local._7_1_ = false;
  }
  else {
    KFIXED<char,_(unsigned_char)'\x03'>::KFIXED(local_50,&local_20->m_Theta);
    KVar1 = KFIXED<char,_(unsigned_char)'\x03'>::operator!=(&this->m_Theta,local_50);
    KFIXED<char,_(unsigned_char)'\x03'>::~KFIXED(local_50);
    if (KVar1) {
      this_local._7_1_ = false;
    }
    else {
      KFIXED<char,_(unsigned_char)'\x03'>::KFIXED(&local_60,&local_20->m_Phi);
      KVar1 = KFIXED<char,_(unsigned_char)'\x03'>::operator!=(&this->m_Phi,&local_60);
      KFIXED<char,_(unsigned_char)'\x03'>::~KFIXED(&local_60);
      if (KVar1) {
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

KBOOL LE_EulerAngles::operator == ( const LE_EulerAngles & Value ) const
{
    if( m_Psi    != Value.m_Psi )     return false;
    if( m_Theta  != Value.m_Theta )   return false;
    if( m_Phi    != Value.m_Phi )     return false;
    return true;
}